

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mem;
  
  pcVar2 = (state->cur_)._M_current;
  save_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&mem,(detail *)state,next);
  if (this[8] ==
      (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
       )0x1) {
    bVar1 = state->found_partial_match_;
    bVar3 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    (state->action_list_).next = mem.action_list_head_;
    state->action_list_tail_ = mem.action_list_tail_;
    *mem.action_list_tail_ = (actionable *)0x0;
    if (bVar3 == 0) {
      cVar4 = (**(code **)((next->cur_)._M_current + 0x10))(next,state);
      if (cVar4 == '\0') {
        reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (&mem,state,false);
        state->found_partial_match_ = bVar1;
        goto LAB_0012df4f;
      }
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mem,state,true);
    }
    else {
      restore_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mem,state);
      (state->cur_)._M_current = pcVar2;
    }
    bVar3 = bVar3 ^ 1;
    state->found_partial_match_ = bVar1;
  }
  else {
    cVar4 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (cVar4 == '\0') {
      (state->action_list_).next = mem.action_list_head_;
      state->action_list_tail_ = mem.action_list_tail_;
      *mem.action_list_tail_ = (actionable *)0x0;
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mem,state,false);
      return false;
    }
    (state->cur_)._M_current = pcVar2;
    (state->action_list_).next = mem.action_list_head_;
    state->action_list_tail_ = mem.action_list_tail_;
    *mem.action_list_tail_ = (actionable *)0x0;
    cVar4 = (**(code **)((next->cur_)._M_current + 0x10))(next,state);
    if (cVar4 != '\0') {
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mem,state,true);
      return true;
    }
    restore_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&mem,state);
LAB_0012df4f:
    bVar3 = 0;
  }
  return (bool)bVar3;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            BidiIter const tmp = state.cur_;

            // matching xpr could produce side-effects, save state
            memento<BidiIter> mem = save_sub_matches(state);

            if(this->not_)
            {
                // negative look-ahead assertions do not trigger partial matches.
                save_restore<bool> partial_match(state.found_partial_match_);
                detail::ignore_unused(partial_match);

                if(this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    restore_sub_matches(mem, state);
                    state.cur_ = tmp;
                    return false;
                }
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                reclaim_sub_matches(mem, state, false);
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    reclaim_sub_matches(mem, state, false);
                    return false;
                }
                state.cur_ = tmp;
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                restore_sub_matches(mem, state);
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }